

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O2

void base64_decode(char *in,char *out)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  char cVar7;
  char *pcVar8;
  unsigned_long blen;
  long local_28;
  
  sVar2 = strlen(in);
  pcVar3 = out;
  if (*in == '$') {
    pcVar3 = (char *)malloc((long)(int)sVar2);
  }
  uVar4 = 0;
  for (iVar6 = 0; lVar5 = (long)iVar6, iVar6 < (int)sVar2; iVar6 = iVar6 + 4) {
    cVar7 = in[lVar5];
    if (cVar7 == '$') {
      iVar6 = iVar6 + 2;
      lVar5 = (long)iVar6 << 0x20;
      for (pcVar8 = in + iVar6; (pcVar8[-1] != '$' && (*pcVar8 != '\0')); pcVar8 = pcVar8 + 1) {
        iVar6 = iVar6 + 1;
        lVar5 = lVar5 + 0x100000000;
      }
      lVar5 = lVar5 >> 0x20;
      cVar7 = in[lVar5];
    }
    pcVar3[uVar4] = ""[in[lVar5 + 1]] >> 4 | ""[cVar7] << 2;
    pcVar3[uVar4 + 1] = ""[in[lVar5 + 2]] >> 2 | ""[in[lVar5 + 1]] << 4;
    pcVar3[uVar4 + 2] = ""[in[lVar5 + 2]] << 6 | ""[in[lVar5 + 3]];
    uVar4 = uVar4 + 3;
  }
  cVar7 = in[lVar5 + -2];
  if (((cVar7 == '=') || (cVar7 == '\0')) && ((in[lVar5 + -1] == '=' || (in[lVar5 + -1] == '\0'))))
  {
    uVar4 = (ulong)((int)uVar4 - 1);
  }
  iVar6 = (int)uVar4;
  if (in[lVar5 + -3] == '=') {
    if (cVar7 != '=') goto LAB_001b13fd;
  }
  else {
    if (cVar7 != '\0') goto LAB_001b1407;
LAB_001b13fd:
    if (in[lVar5 + -1] != '\0') goto LAB_001b1407;
  }
  iVar6 = iVar6 + -1;
LAB_001b1407:
  pcVar3[iVar6] = '\0';
  if (*in == '$') {
    iVar1 = base64_strlen(in);
    local_28 = (long)iVar1;
    iVar6 = uncompress(out,&local_28,pcVar3,(long)iVar6);
    free(pcVar3);
    if (iVar6 != 0) {
      lVar5 = ftell((FILE *)loginfo.flog);
      if (iVar6 == -5) {
        pcVar3 = "Invalid size";
      }
      else if (iVar6 == -4) {
        pcVar3 = "Out of memory";
      }
      else {
        pcVar3 = "(unknown error)";
        if (iVar6 == -3) {
          pcVar3 = "Corrupted file";
        }
      }
      raw_printf("Decompressing save file failed at %ld: %s",lVar5,pcVar3);
      terminate();
    }
  }
  return;
}

Assistant:

static void base64_decode(const char *in, char *out)
{
    int i, len = strlen(in), pos = 0;
    char *o = out;

    if (*in == '$')
	o = malloc(len);

    for (i = 0; i < len; i += 4) {
	/* skip data between $ signs, it's the header for compressed data */
	if (in[i] == '$') {
	    for (i += 2; in[i-1] != '$' && in[i]; i++)
		/* empty */;
	}

	/* decode blocks; padding '=' are converted to 0 in the decoding table */
	o[pos  ] =   b64d[(int)in[i  ]] << 2          | b64d[(int)in[i+1]] >> 4;
	o[pos+1] =   b64d[(int)in[i+1]] << 4          | b64d[(int)in[i+2]] >> 2;
	o[pos+2] = ((b64d[(int)in[i+2]] << 6) & 0xc0) | b64d[(int)in[i+3]];
	pos += 3;
    }

    i -= 4;
    if ((in[i+2] == '=' || !in[i+2]) && (in[i+3] == '=' || !in[i+3])) pos--;
    if ((in[i+1] == '=' || !in[i+2]) && (in[i+2] == '=' || !in[i+3])) pos--;

    o[pos] = 0;

    if (*in == '$') {
	unsigned long blen = base64_strlen(in);
	int errcode = uncompress((unsigned char *)out, &blen,
				 (unsigned char *)o, pos);
	free(o);
	if (errcode != Z_OK) {
	    raw_printf("Decompressing save file failed at %ld: %s",
		       ftell(loginfo.flog),
		       errcode == Z_MEM_ERROR ? "Out of memory" :
		       errcode == Z_BUF_ERROR ? "Invalid size" :
		       errcode == Z_DATA_ERROR ? "Corrupted file" :
		       "(unknown error)");
	    terminate();
	}
    }
}